

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

void __thiscall
pbrt::DisplayItem::ImageChannelBuffer::ImageChannelBuffer
          (ImageChannelBuffer *this,string *channelName,int nTiles,string *title)

{
  pointer puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint64_t zeroHash;
  ulong local_30;
  
  this->tileBoundsOffset = 0;
  this->channelValuesOffset = 0;
  (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->tileBoundsOffset = 0;
  this->channelValuesOffset = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->buffer,(long)((int)title->_M_string_length + 0x10020));
  puVar5 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5[0] = '\0';
  puVar5[1] = '\0';
  puVar5[2] = '\0';
  puVar5[3] = '\0';
  puVar5[4] = '\x03';
  puVar5[5] = '\0';
  puVar5 = puVar5 + 6;
  if (title->_M_string_length != 0) {
    uVar6 = 0;
    do {
      puVar5[uVar6] = (title->_M_dataplus)._M_p[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < title->_M_string_length);
    puVar5 = puVar5 + uVar6;
  }
  *puVar5 = '\0';
  puVar5 = puVar5 + 1;
  if (channelName->_M_string_length != 0) {
    uVar6 = 0;
    do {
      puVar5[uVar6] = (channelName->_M_dataplus)._M_p[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < channelName->_M_string_length);
    puVar5 = puVar5 + uVar6;
  }
  *puVar5 = '\0';
  lVar8 = 0;
  puVar1 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = (int)puVar5 - (int)puVar1;
  iVar4 = iVar3 + 0x11;
  this->tileBoundsOffset = iVar3 + 1;
  this->channelValuesOffset = iVar4;
  memset(puVar1 + iVar4,0,0x10000);
  uVar6 = 0xa7935bd1e9950000;
  do {
    lVar2 = lVar8 + this->channelValuesOffset;
    lVar8 = lVar8 + 8;
    uVar7 = *(long *)((this->buffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar2) * -0x395b586ca42e166b;
    uVar6 = (uVar6 ^ (uVar7 >> 0x2f ^ uVar7) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
  } while (lVar8 != 0x10000);
  local_30 = (uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b;
  local_30 = local_30 >> 0x2f ^ local_30;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_fill_assign
            (&this->tileHashes,(long)nTiles,&local_30);
  return;
}

Assistant:

DisplayItem::ImageChannelBuffer::ImageChannelBuffer(const std::string &channelName,
                                                    int nTiles,
                                                    const std::string &title) {
    int bufferAlloc = tileSize * tileSize * sizeof(float) + title.size() + 32;

    buffer.resize(bufferAlloc);

    uint8_t *ptr = buffer.data();
    Serialize(&ptr, int(0));  // reserve space for message length
    Serialize(&ptr, DisplayDirective::UpdateImage);
    uint8_t grabFocus = 0;
    Serialize(&ptr, grabFocus);
    Serialize(&ptr, title);
    Serialize(&ptr, channelName);

    tileBoundsOffset = ptr - buffer.data();
    // Note: may not be float-aligned, but that's not a problem on x86...
    // TODO: fix this. The problem is that it breaks the whole idea of
    // passing a span<Float> to the callback function...
    channelValuesOffset = tileBoundsOffset + 4 * sizeof(int);

    // Zero-initialize the buffer color contents before computing the hash
    // for a fully-zero tile (which corresponds to the initial state on the
    // viewer side.)
    memset(buffer.data() + channelValuesOffset, 0, tileSize * tileSize * sizeof(float));
    uint64_t zeroHash = HashBuffer(buffer.data() + channelValuesOffset,
                                   tileSize * tileSize * sizeof(float));
    tileHashes.assign(nTiles, zeroHash);
}